

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int VP8ExitCritical(VP8Decoder *dec,VP8Io *io)

{
  WebPWorkerInterface *pWVar1;
  long in_RSI;
  long in_RDI;
  int ok;
  int local_14;
  
  local_14 = 1;
  if (0 < *(int *)(in_RDI + 200)) {
    pWVar1 = WebPGetWorkerInterface();
    local_14 = (*pWVar1->Sync)((WebPWorker *)(in_RDI + 0x98));
  }
  if (*(long *)(in_RSI + 0x50) != 0) {
    (**(code **)(in_RSI + 0x50))(in_RSI);
  }
  return local_14;
}

Assistant:

int VP8ExitCritical(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 1;
  if (dec->mt_method_ > 0) {
    ok = WebPGetWorkerInterface()->Sync(&dec->worker_);
  }

  if (io->teardown != NULL) {
    io->teardown(io);
  }
  return ok;
}